

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

void glfwMakeContextCurrent(GLFWwindow *handle)

{
  void *pvVar1;
  _GLFWwindow *previous;
  _GLFWwindow *window;
  GLFWwindow *handle_local;
  
  pvVar1 = _glfwPlatformGetTls(&_glfw.contextSlot);
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if ((handle == (GLFWwindow *)0x0) || (*(int *)(handle + 0x1f8) != 0)) {
    if ((pvVar1 != (void *)0x0) &&
       ((handle == (GLFWwindow *)0x0 || (*(int *)(handle + 0x1fc) != *(int *)((long)pvVar1 + 0x1fc))
        ))) {
      (**(code **)((long)pvVar1 + 0x240))(0);
    }
    if (handle != (GLFWwindow *)0x0) {
      (**(code **)(handle + 0x240))(handle);
    }
  }
  else {
    _glfwInputError(0x1000a,
                    "Cannot make current with a window that has no OpenGL or OpenGL ES context");
  }
  return;
}

Assistant:

GLFWAPI void glfwMakeContextCurrent(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    _GLFWwindow* previous = _glfwPlatformGetTls(&_glfw.contextSlot);

    _GLFW_REQUIRE_INIT();

    if (window && window->context.client == GLFW_NO_API)
    {
        _glfwInputError(GLFW_NO_WINDOW_CONTEXT,
                        "Cannot make current with a window that has no OpenGL or OpenGL ES context");
        return;
    }

    if (previous)
    {
        if (!window || window->context.source != previous->context.source)
            previous->context.makeCurrent(NULL);
    }

    if (window)
        window->context.makeCurrent(window);
}